

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O0

int mixed_buffer_resize(uint32_t size,mixed_buffer *buffer)

{
  float *pfVar1;
  float *new;
  mixed_buffer *buffer_local;
  uint32_t size_local;
  
  mixed_err(0);
  pfVar1 = (float *)(*mixed_realloc)(buffer->_data,(ulong)size << 2);
  if (pfVar1 != (float *)0x0) {
    buffer->_data = pfVar1;
    buffer->size = size;
  }
  else {
    mixed_err(1);
  }
  buffer_local._4_4_ = (uint)(pfVar1 != (float *)0x0);
  return buffer_local._4_4_;
}

Assistant:

MIXED_EXPORT int mixed_buffer_resize(uint32_t size, struct mixed_buffer *buffer){
  mixed_err(MIXED_NO_ERROR);
  float *new = mixed_realloc(buffer->_data, size*sizeof(float));
  if(!new){
    mixed_err(MIXED_OUT_OF_MEMORY);
    return 0;
  }
  buffer->_data = new;
  buffer->size = size;
  return 1;
}